

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QList<QString>>::emplace<QList<QString>>
          (QMovableArrayOps<QList<QString>_> *this,qsizetype i,QList<QString> *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QList<QString> *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QList<QString> tmp;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  byte bVar6;
  Inserter *this_00;
  Inserter local_48;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QList<QString>_>::needsDetach
                    ((QArrayDataPointer<QList<QString>_> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QList<QString>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<QList<QString>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      QArrayDataPointer<QList<QString>_>::end((QArrayDataPointer<QList<QString>_> *)in_RDI);
      QList<QString>::QList
                ((QList<QString> *)in_RDI,
                 (QList<QString> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceTo = (QList<QString> *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00116532;
    }
    if ((in_RSI == (QList<QString> *)0x0) &&
       (qVar3 = QArrayDataPointer<QList<QString>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<QList<QString>_> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT24(in_stack_ffffffffffffff9c,
                                                            in_stack_ffffffffffffff98)))),
       qVar3 != 0)) {
      QArrayDataPointer<QList<QString>_>::begin((QArrayDataPointer<QList<QString>_> *)0x1163f4);
      QList<QString>::QList
                ((QList<QString> *)in_RDI,
                 (QList<QString> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QList<QString> *)((long)&(in_RDI->displaceTo->d).d + 1);
      goto LAB_00116532;
    }
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QList<QString>::QList
            ((QList<QString> *)in_RDI,
             (QList<QString> *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar4 = in_RDI->displaceTo != (QList<QString> *)0x0;
  uVar5 = bVar4 && in_RSI == (QList<QString> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QList<QString> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QList<QString>_>::detachAndGrow
            ((QArrayDataPointer<QList<QString>_> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QList<QString> **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
             (QArrayDataPointer<QList<QString>_> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    QMovableArrayOps<QList<QString>_>::Inserter::Inserter
              (in_RDX,(QArrayDataPointer<QList<QString>_> *)
                      CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff9c,uVar2))),
               (qsizetype)in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff88));
    QMovableArrayOps<QList<QString>_>::Inserter::insertOne
              (in_RDI,(QList<QString> *)CONCAT17(uVar5,in_stack_ffffffffffffff88));
    QMovableArrayOps<QList<QString>_>::Inserter::~Inserter(&local_48);
  }
  else {
    QArrayDataPointer<QList<QString>_>::begin((QArrayDataPointer<QList<QString>_> *)0x1164c6);
    QList<QString>::QList
              ((QList<QString> *)in_RDI,(QList<QString> *)CONCAT17(uVar5,in_stack_ffffffffffffff88))
    ;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QList<QString> *)((long)&(in_RDI->displaceTo->d).d + 1);
  }
  QList<QString>::~QList((QList<QString> *)0x116532);
LAB_00116532:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }